

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O0

PatternGeneration * __thiscall
PatternGeneration::getPerlinNoiseTexture
          (PatternGeneration *this,int *imageSize,bool *random_colors,double *z1,double *z2,
          double *z3)

{
  result_type_conflict1 rVar1;
  result_type rVar2;
  element_type *peVar3;
  double *pdVar4;
  Vec<unsigned_char,_3> *pVVar5;
  int iVar6;
  pointer *__return_storage_ptr__;
  double dVar7;
  double dVar8;
  double dVar9;
  double *in_stack_00000008;
  _InputArray local_2800;
  _InputArray local_27e8;
  undefined2 local_27cb;
  uchar local_27c9;
  undefined1 local_27c8 [8];
  Vec3d val;
  double y;
  double x;
  int j;
  int i;
  mt19937 mt;
  random_device rd;
  undefined1 local_78 [8];
  PerlinNoise pn;
  double *z2_local;
  double *z1_local;
  bool *random_colors_local;
  int *imageSize_local;
  PatternGeneration *this_local;
  Mat *image;
  
  iVar6 = *(int *)random_colors;
  __return_storage_ptr__ =
       &pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  cv::Scalar_<double>::all((Scalar_<double> *)__return_storage_ptr__,0.0);
  cv::Mat::Mat((Mat *)this,iVar6,iVar6,0x10,(Scalar_ *)__return_storage_ptr__);
  PerlinNoise::PerlinNoise((PerlinNoise *)local_78);
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar1 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&j,(ulong)rVar1);
  for (x._4_4_ = 0; iVar6 = (int)__return_storage_ptr__, x._4_4_ < *(int *)random_colors;
      x._4_4_ = x._4_4_ + 1) {
    for (x._0_4_ = 0; x._0_4_ < *(int *)random_colors; x._0_4_ = x._0_4_ + 1) {
      dVar7 = (double)x._0_4_ / (double)*(int *)random_colors;
      val.super_Matx<double,_3,_1>.val[2] = (double)x._4_4_ / (double)*(int *)random_colors;
      cv::Vec<double,_3>::Vec((Vec<double,_3> *)local_27c8);
      dVar8 = val.super_Matx<double,_3,_1>.val[2];
      if (((ulong)*z1 & 1) == 0) {
        dVar8 = PerlinNoise::noise((PerlinNoise *)local_78,dVar7,val.super_Matx<double,_3,_1>.val[2]
                                   ,*z2);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        *pdVar4 = dVar8 * 20.0;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        dVar8 = *pdVar4;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        dVar9 = floor(*pdVar4);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        *pdVar4 = dVar8 - dVar9;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        dVar8 = floor(*pdVar4 * 255.0);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        *pdVar4 = dVar8;
        dVar8 = PerlinNoise::noise((PerlinNoise *)local_78,dVar7,val.super_Matx<double,_3,_1>.val[2]
                                   ,*z3);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        *pdVar4 = dVar8 * 20.0;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        dVar8 = *pdVar4;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        dVar9 = floor(*pdVar4);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        *pdVar4 = dVar8 - dVar9;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        dVar8 = floor(*pdVar4 * 255.0);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        *pdVar4 = dVar8;
        dVar8 = PerlinNoise::noise((PerlinNoise *)local_78,dVar7,val.super_Matx<double,_3,_1>.val[2]
                                   ,*in_stack_00000008);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        *pdVar4 = dVar8 * 20.0;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        dVar8 = *pdVar4;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        dVar7 = floor(*pdVar4);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        *pdVar4 = dVar8 - dVar7;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        dVar8 = floor(*pdVar4 * 255.0);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        *pdVar4 = dVar8;
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)imageSize);
        rVar2 = std::uniform_int_distribution<int>::operator()
                          (peVar3,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                   *)&j);
        dVar8 = PerlinNoise::noise((PerlinNoise *)local_78,dVar7,dVar8,(double)rVar2 / 2147483647.0)
        ;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        *pdVar4 = dVar8 * 20.0;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        dVar8 = *pdVar4;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        dVar9 = floor(*pdVar4);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        *pdVar4 = dVar8 - dVar9;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        dVar9 = floor(*pdVar4 * 255.0);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,0);
        dVar8 = val.super_Matx<double,_3,_1>.val[2];
        *pdVar4 = dVar9;
        peVar3 = std::
                 __shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)imageSize);
        rVar2 = std::uniform_int_distribution<int>::operator()
                          (peVar3,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                   *)&j);
        dVar8 = PerlinNoise::noise((PerlinNoise *)local_78,dVar7,dVar8,(double)rVar2 / 2147483647.0)
        ;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        *pdVar4 = dVar8 * 20.0;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        dVar8 = *pdVar4;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        dVar9 = floor(*pdVar4);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        *pdVar4 = dVar8 - dVar9;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        dVar9 = floor(*pdVar4 * 255.0);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,1);
        dVar8 = val.super_Matx<double,_3,_1>.val[2];
        *pdVar4 = dVar9;
        peVar3 = std::
                 __shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)imageSize);
        rVar2 = std::uniform_int_distribution<int>::operator()
                          (peVar3,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                   *)&j);
        dVar8 = PerlinNoise::noise((PerlinNoise *)local_78,dVar7,dVar8,(double)rVar2 / 2147483647.0)
        ;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        *pdVar4 = dVar8 * 20.0;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        dVar8 = *pdVar4;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        dVar7 = floor(*pdVar4);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        *pdVar4 = dVar8 - dVar7;
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        dVar8 = floor(*pdVar4 * 255.0);
        pdVar4 = cv::Vec<double,_3>::operator[]((Vec<double,_3> *)local_27c8,2);
        *pdVar4 = dVar8;
      }
      cv::Vec::operator_cast_to_Vec((Vec *)&local_27cb);
      pVVar5 = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)this,x._4_4_,x._0_4_);
      *(undefined2 *)(pVVar5->super_Matx<unsigned_char,_3,_1>).val = local_27cb;
      (pVVar5->super_Matx<unsigned_char,_3,_1>).val[2] = local_27c9;
    }
  }
  cv::_InputArray::_InputArray(&local_27e8,(Mat *)this);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_2800,(Mat *)this);
  cv::cvtColor((cv *)&local_27e8,&local_2800,(_OutputArray *)0x39,0,iVar6);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_2800);
  cv::_InputArray::~_InputArray(&local_27e8);
  std::random_device::~random_device((random_device *)&mt._M_p);
  PerlinNoise::~PerlinNoise((PerlinNoise *)local_78);
  return this;
}

Assistant:

cv::Mat PatternGeneration::getPerlinNoiseTexture(
    const int & imageSize,
    const bool & random_colors,
    const double & z1,
    const double & z2,
    const double & z3)
{
    // Create an empty PPM image
    cv::Mat image(imageSize,imageSize,CV_8UC3,cv::Scalar::all(0));
    // Create a PerlinNoise object with a random permutation vector generated with seed
    //unsigned int seed = (*dist)(mt);
    PerlinNoise pn;

    std::random_device rd;
    std::mt19937 mt(rd());

    // Visit every pixel of the image and assign a color generated with Perlin noise
    #pragma omp parallel for
    for (int i = 0; i < imageSize; ++i) {      // y
        for (int j = 0; j < imageSize; ++j) {  // x

            double x = (double)j/((double)imageSize);
            double y = (double)i/((double)imageSize);

            cv::Vec3d val;

            // Wood like structure
            if(random_colors)
            {
                // Red
                val[0] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[0] = val[0] - floor(val[0]);
                val[0] = floor(255 * val[0]);
                // Green
                val[1] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[1] = val[1] - floor(val[1]);
                val[1] = floor(255 * val[1]);
                // Blue
                val[2] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[2] = val[2] - floor(val[2]);
                val[2] = floor(255 * val[2]);

            } else {

                // Red
                val[0] = 20.0 * pn.noise(x, y, z1);
                val[0] = val[0] - floor(val[0]);
                val[0] = floor(255 * val[0]);
                // Green
                val[1] = 20.0 * pn.noise(x, y, z2);
                val[1] = val[1] - floor(val[1]);
                val[1] = floor(255 * val[1]);
                // Blue
                val[2] = 20.0 * pn.noise(x, y, z3);
                val[2] = val[2] - floor(val[2]);
                val[2] = floor(255 * val[2]);

            }
            image.at<cv::Vec3b>(i,j) = val;
        }
    }
    cvtColor(image,image,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return image;
}